

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

vector<int,_std::allocator<int>_> *
QUtil::parse_numrange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,char *range,int max)

{
  char cVar1;
  pointer piVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *__s1;
  char *__e;
  size_type sVar9;
  reference __args;
  runtime_error *prVar10;
  long lVar11;
  byte bVar12;
  sub_match<const_char_*> *psVar13;
  undefined1 is_span;
  pointer piVar14;
  size_t i;
  vector<int,_std::allocator<int>_> last_group;
  vector<int,_std::allocator<int>_> result;
  vector<int,_std::allocator<int>_> work;
  ulong local_f8;
  int max_local;
  cmatch m;
  anon_class_8_1_ba1d60c4 parse_num;
  set<int,_std::less<int>,_std::allocator<int>_> exclusions;
  int n;
  
  max_local = max;
  if ((parse_numrange(char_const*,int)::group_re_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&parse_numrange(char_const*,int)::group_re_abi_cxx11_), iVar5 != 0
     )) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_numrange(char_const*,int)::group_re_abi_cxx11_,
               "(x)?(z|r?\\d+)(?:-(z|r?\\d+))?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_numrange(char_const*,int)::group_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_numrange(char_const*,int)::group_re_abi_cxx11_);
  }
  parse_num.max = &max_local;
  sVar8 = strlen(range);
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  exclusions._M_t._M_impl._0_1_ = 0x3a;
  __s1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                   (range,range + sVar8);
  cVar1 = *__s1;
  if (cVar1 == ':') {
    iVar5 = strcmp(__s1,":odd");
    if (iVar5 == 0) {
      local_f8 = 0;
    }
    else {
      iVar5 = strcmp(__s1,":even");
      if (iVar5 != 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"expected :even or :odd");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_f8 = 1;
    }
  }
  else {
    local_f8 = 0;
    __s1 = range + sVar8;
  }
  bVar4 = 1;
  do {
    if (range == __s1) {
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)&result,
                 (const_iterator)
                 result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (cVar1 == ':') {
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (; local_f8 <
               (ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2); local_f8 = local_f8 + 2) {
          __args = std::vector<int,_std::allocator<int>_>::at(&result,local_f8);
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__args);
        }
      }
      else {
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start =
             result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&last_group.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&result.super__Vector_base<int,_std::allocator<int>_>);
      return __return_storage_ptr__;
    }
    exclusions._M_t._M_impl._0_1_ = 0x2c;
    __e = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (range,__s1,(string_type *)&exclusions);
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    m._M_begin = (char *)0x0;
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    m.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar5 = 0;
    bVar3 = std::__detail::
            __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (range,__e,&m,&parse_numrange(char_const*,int)::group_re_abi_cxx11_,0);
    if (!bVar3) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"invalid range syntax");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar11 = (long)m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar11 == 0) {
      bVar12 = m.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-3].matched;
      if ((bVar4 & bVar12) != 0) goto LAB_001f5002;
LAB_001f4d11:
      psVar13 = (sub_match<const_char_*> *)
                ((long)m.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x48);
    }
    else {
      if (lVar11 / 0x18 - 5U < 0xfffffffffffffffe) {
        bVar12 = m.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].matched;
      }
      else {
        bVar12 = *(byte *)((long)m.
                                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x38);
      }
      if ((bVar4 & bVar12) != 0) {
LAB_001f5002:
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"first range group may not be an exclusion");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (0xfffffffffffffffc < lVar11 / 0x18 - 6U) goto LAB_001f4d11;
      psVar13 = m.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 2;
    }
    std::__cxx11::sub_match<const_char_*>::str((string_type *)&exclusions,psVar13);
    uVar6 = parse_numrange::anon_class_8_1_ba1d60c4::operator()
                      (&parse_num,(string_type *)&exclusions);
    std::__cxx11::string::~string((string *)&exclusions);
    lVar11 = (long)m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)m.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar11 == 0) || (0xfffffffffffffffb < lVar11 / 0x18 - 7U)) {
      bVar4 = 0;
      is_span = false;
      if (*(char *)((long)m.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x38) != '\0') {
        psVar13 = (sub_match<const_char_*> *)
                  ((long)m.
                         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x48);
        goto LAB_001f4d94;
      }
    }
    else {
      bVar4 = 0;
      is_span = false;
      if (m.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start[3].matched != false) {
        psVar13 = m.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 3;
LAB_001f4d94:
        std::__cxx11::sub_match<const_char_*>::str((string_type *)&exclusions,psVar13);
        iVar7 = parse_numrange::anon_class_8_1_ba1d60c4::operator()
                          (&parse_num,(string_type *)&exclusions);
        is_span = (undefined1)iVar7;
        std::__cxx11::string::~string((string *)&exclusions);
        bVar4 = 1;
      }
    }
    if ((bVar12 & 1) == 0) {
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)&result,
                 (const_iterator)
                 result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      parse_numrange::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&last_group,
                 (vector<int,_std::allocator<int>_> *)(ulong)uVar6,(uint)bVar4,(bool)is_span,iVar5);
    }
    else {
      work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      parse_numrange::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&work,(vector<int,_std::allocator<int>_> *)(ulong)uVar6,
                 (uint)bVar4,(bool)is_span,iVar5);
      exclusions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      exclusions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      exclusions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &exclusions._M_t._M_impl.super__Rb_tree_header._M_header;
      exclusions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      exclusions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           exclusions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &exclusions,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      std::vector<int,_std::allocator<int>_>::operator=(&work,&last_group);
      piVar2 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar14 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      for (; piVar14 != piVar2; piVar14 = piVar14 + 1) {
        n = *piVar14;
        sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&exclusions,&n);
        if (sVar9 == 0) {
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    ((vector<int,std::allocator<int>> *)&last_group,&n);
        }
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &exclusions);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&work.super__Vector_base<int,_std::allocator<int>_>);
    }
    range = __e;
    if ((*__e == ',') && (range = __e + 1, range == __s1)) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"trailing comma");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)&m);
    bVar4 = 0;
  } while( true );
}

Assistant:

std::vector<int>
QUtil::parse_numrange(char const* range, int max)
{
    // Performance note: this implementation aims to be straightforward, not efficient. Numeric
    // range parsing is used only during argument processing. It is not used during processing of
    // PDF files.

    static std::regex group_re(R"((x)?(z|r?\d+)(?:-(z|r?\d+))?)");
    auto parse_num = [&max](std::string const& s) -> int {
        if (s == "z") {
            return max;
        }
        int num;
        if (s.at(0) == 'r') {
            num = max + 1 - string_to_int(s.substr(1).c_str());
        } else {
            num = string_to_int(s.c_str());
        }
        // max == 0 means we don't know the max and are just testing for valid syntax.
        if ((max > 0) && ((num < 1) || (num > max))) {
            throw std::runtime_error("number " + std::to_string(num) + " out of range");
        }
        return num;
    };

    auto populate = [](std::vector<int>& group, int first_num, bool is_span, int last_num) {
        group.clear();
        group.emplace_back(first_num);
        if (is_span) {
            if (first_num > last_num) {
                for (auto i = first_num - 1; i >= last_num; --i) {
                    group.push_back(i);
                }
            } else {
                for (auto i = first_num + 1; i <= last_num; ++i) {
                    group.push_back(i);
                }
            }
        }
    };

    char const* p;
    try {
        char const* range_end = range + strlen(range);
        std::vector<int> result;
        std::vector<int> last_group;
        // See if range ends with :even or :odd.
        size_t start_idx = 0;
        size_t skip = 1;
        p = std::find(range, range_end, ':');
        if (*p == ':') {
            if (strcmp(p, ":odd") == 0) {
                skip = 2;
            } else if (strcmp(p, ":even") == 0) {
                skip = 2;
                start_idx = 1;
            } else {
                throw std::runtime_error("expected :even or :odd");
            }
            range_end = p;
        }

        // Divide the range into groups
        p = range;
        char const* group_end;
        bool first = true;
        while (p != range_end) {
            group_end = std::find(p, range_end, ',');
            std::cmatch m;
            if (!std::regex_match(p, group_end, m, group_re)) {
                throw std::runtime_error("invalid range syntax");
            }
            auto is_exclude = m[1].matched;
            if (first && is_exclude) {
                throw std::runtime_error("first range group may not be an exclusion");
            }
            first = false;
            auto first_num = parse_num(m[2].str());
            auto is_span = m[3].matched;
            int last_num{0};
            if (is_span) {
                last_num = parse_num(m[3].str());
            }
            if (is_exclude) {
                std::vector<int> work;
                populate(work, first_num, is_span, last_num);
                std::set<int> exclusions;
                exclusions.insert(work.begin(), work.end());
                work = last_group;
                last_group.clear();
                for (auto n: work) {
                    if (exclusions.count(n) == 0) {
                        last_group.emplace_back(n);
                    }
                }
            } else {
                result.insert(result.end(), last_group.begin(), last_group.end());
                populate(last_group, first_num, is_span, last_num);
            }
            p = group_end;
            if (*p == ',') {
                ++p;
                if (p == range_end) {
                    throw std::runtime_error("trailing comma");
                }
            }
        }
        result.insert(result.end(), last_group.begin(), last_group.end());
        if (skip == 1) {
            return result;
        }
        std::vector<int> filtered;
        for (auto i = start_idx; i < result.size(); i += skip) {
            filtered.emplace_back(result.at(i));
        }
        return filtered;
    } catch (std::runtime_error const& e) {
        std::string message;
        if (p) {
            message = "error at * in numeric range " +
                std::string(range, QIntC::to_size(p - range)) + "*" + p + ": " + e.what();
        } else {
            message = "error in numeric range " + std::string(range) + ": " + e.what();
        }
        throw std::runtime_error(message);
    }
}